

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  anon_struct_424_12_03782e7a_for_AutogenTarget *utilityName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *this_01;
  pointer pcVar4;
  char *workingDirectory;
  byte bVar5;
  TargetType TVar6;
  cmLocalGenerator *lg;
  string *psVar7;
  long lVar8;
  _Rb_tree_node_base *p_Var9;
  cmLinkImplementationLibraries *pcVar10;
  mapped_type_conflict2 *pmVar11;
  cmTarget *t;
  cmGeneratorTarget *pcVar12;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar13;
  cmLinkItem *item;
  pointer pcVar14;
  pointer pcVar15;
  string *psVar16;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar17;
  cmGeneratorTarget *local_280;
  cmCustomCommandLine currentLine;
  string autogenComment;
  _Alloc_hider local_210;
  string tools;
  pointer local_1e8;
  pointer pbStack_1e0;
  pointer local_1d8;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenProvides;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_deps;
  cmGeneratorTarget *libTarget;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this_00 = this->Target->Target->Makefile;
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  pcVar2 = lg->GlobalGenerator;
  psVar16 = &(this->AutogenTarget).InfoFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this_00->OutputFiles,psVar16);
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = (this->Moc).super_GenVarsT.Enabled;
  if ((bool)bVar5 == true) {
    psVar7 = &(this->Moc).MocsCompilation;
    AddGeneratedSource(this,psVar7,&(this->Moc).super_GenVarsT,true);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&autogenProvides,psVar7);
    bVar5 = (this->Moc).super_GenVarsT.Enabled;
  }
  autogenComment._M_dataplus._M_p = (pointer)&autogenComment.field_2;
  autogenComment._M_string_length = 0;
  autogenComment.field_2._M_local_buf[0] = '\0';
  paVar1 = &tools.field_2;
  tools._M_string_length = 0;
  tools.field_2._M_allocated_capacity = tools.field_2._M_allocated_capacity & 0xffffffffffffff00;
  tools._M_dataplus._M_p = (pointer)paVar1;
  if ((bVar5 & 1) != 0) {
    std::__cxx11::string::append((char *)&tools);
  }
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    if (tools._M_string_length != 0) {
      std::__cxx11::string::append((char *)&tools);
    }
    std::__cxx11::string::append((char *)&tools);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&autogenComment,0,(char *)autogenComment._M_string_length,0x540ac0);
  std::__cxx11::string::_M_append((char *)&autogenComment,(ulong)tools._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&autogenComment);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  std::__cxx11::string::_M_append((char *)&autogenComment,(ulong)(psVar7->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != paVar1) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,psVar7);
  tools._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"-E","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != paVar1) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  tools._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"cmake_autogen","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != paVar1) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,psVar16);
  tools._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"$<CONFIGURATION>","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != paVar1) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
  emplace_back<cmCustomCommandLine>
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             &currentLine);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  (*pcVar2->_vptr_cmGlobalGenerator[3])(&tools,pcVar2);
  lVar8 = std::__cxx11::string::find((char *)&tools,0x540aea,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != paVar1) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  if (((lVar8 == -1) || ((this->AutogenTarget).GlobalTarget != false)) ||
     ((this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    if ((this->AutogenTarget).DependOrigin == true) {
      no_deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)no_deps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      no_deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar16 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar7 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar16 != psVar7) {
        do {
          pcVar10 = cmGeneratorTarget::GetLinkImplementationLibraries(this->Target,psVar16);
          if (pcVar10 != (cmLinkImplementationLibraries *)0x0) {
            pcVar3 = (pcVar10->Libraries).
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pcVar15 = (pcVar10->Libraries).
                           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
                           _M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar3;
                pcVar15 = pcVar15 + 1) {
              pcVar12 = (pcVar15->super_cmLinkItem).Target;
              libTarget = pcVar12;
              if (pcVar12 != (cmGeneratorTarget *)0x0) {
                this_01 = this->Target;
                local_280 = pcVar12;
                TVar6 = cmGeneratorTarget::GetType(this_01);
                if ((TVar6 == STATIC_LIBRARY) &&
                   (TVar6 = cmGeneratorTarget::GetType(pcVar12), TVar6 == STATIC_LIBRARY)) {
                  currentLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)((ulong)currentLine.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish &
                                0xffffffff00000000);
                  currentLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_1e8 = (pointer)0x0;
                  pbStack_1e0 = (pointer)0x0;
                  tools.field_2._M_allocated_capacity = 0;
                  tools.field_2._8_8_ = 0;
                  tools._M_dataplus._M_p = (pointer)0x0;
                  tools._M_string_length = 0;
                  std::
                  _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::_M_initialize_map((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                       *)&tools,0);
                  std::
                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  ::_M_insert_unique<cmGeneratorTarget_const*const&>
                            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                              *)&currentLine,&local_280);
                  pcRam0000000000000000 = local_280;
                  local_1d8 = (pointer)0x8;
                  if (tools.field_2._M_allocated_capacity != 8) {
                    do {
                      pcVar12 = *(cmGeneratorTarget **)tools.field_2._M_allocated_capacity;
                      if ((undefined1 *)tools.field_2._M_allocated_capacity ==
                          (undefined1 *)((long)&local_1e8[-1].field_2 + 8U)) {
                        operator_delete((void *)tools.field_2._8_8_,0x200);
                        tools.field_2._M_allocated_capacity = pbStack_1e0->_M_string_length;
                        local_1e8 = (pointer)(tools.field_2._M_allocated_capacity + 0x200);
                        tools.field_2._8_8_ = tools.field_2._M_allocated_capacity;
                        pbStack_1e0 = (pointer)&pbStack_1e0->_M_string_length;
                      }
                      else {
                        tools.field_2._M_allocated_capacity =
                             tools.field_2._M_allocated_capacity + 8;
                      }
                      if (pcVar12 == this_01) {
                        std::
                        _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                        *)&tools);
                        std::
                        _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                        ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                     *)&currentLine);
                        goto LAB_0024631a;
                      }
                      pcVar10 = cmGeneratorTarget::GetLinkImplementationLibraries(pcVar12,psVar16);
                      if (pcVar10 != (cmLinkImplementationLibraries *)0x0) {
                        pcVar4 = (pcVar10->Libraries).
                                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                        for (pcVar14 = (pcVar10->Libraries).
                                       super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                       ._M_impl.super__Vector_impl_data._M_start; pcVar14 != pcVar4;
                            pcVar14 = pcVar14 + 1) {
                          local_210._M_p = (pointer)(pcVar14->super_cmLinkItem).Target;
                          if ((((cmGeneratorTarget *)local_210._M_p != (cmGeneratorTarget *)0x0) &&
                              (TVar6 = cmGeneratorTarget::GetType
                                                 ((cmGeneratorTarget *)local_210._M_p),
                              TVar6 == STATIC_LIBRARY)) &&
                             (pVar17 = std::
                                       _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                       ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                                 ((
                                                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                                  *)&currentLine,(cmGeneratorTarget **)&local_210),
                             ((undefined1  [16])pVar17 & (undefined1  [16])0x1) !=
                             (undefined1  [16])0x0)) {
                            if (local_1d8 == (pointer)0xfffffffffffffff8) {
                              std::
                              deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                              ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                        ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                          *)&tools,(cmGeneratorTarget **)&local_210);
                            }
                            else {
                              (local_1d8->_M_dataplus)._M_p = local_210._M_p;
                              local_1d8 = (pointer)&local_1d8->_M_string_length;
                            }
                          }
                        }
                      }
                    } while (local_1d8 != (pointer)tools.field_2._M_allocated_capacity);
                  }
                  std::
                  _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                  *)&tools);
                  std::
                  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                               *)&currentLine);
                }
                pmVar11 = std::
                          map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                          ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                        *)&no_deps,&libTarget);
                *pmVar11 = *pmVar11 + 1;
              }
LAB_0024631a:
            }
          }
          psVar16 = psVar16 + 1;
        } while (psVar16 != psVar7);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   *)&no_deps);
    }
    workingDirectory = (this->Dir).Work._M_dataplus._M_p;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tools,
               (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header,
               (allocator_type *)&currentLine);
    utilityName = &this->AutogenTarget;
    t = cmMakefile::AddUtilityCommand
                  (this_00,&utilityName->Name,Generator,true,workingDirectory,&autogenProvides,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tools,&commandLines,false,autogenComment._M_dataplus._M_p,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&tools);
    pcVar12 = (cmGeneratorTarget *)operator_new(0x5a8);
    cmGeneratorTarget::cmGeneratorTarget(pcVar12,t,lg);
    cmLocalGenerator::AddGeneratorTarget(lg,pcVar12);
    if ((this->AutogenTarget).DependOrigin == true) {
      psVar13 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->Target);
      for (p_Var9 = (psVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(psVar13->_M_t)._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        cmTarget::AddUtility(t,(string *)(p_Var9 + 1),this_00);
      }
    }
    for (p_Var9 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var9 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      cmTarget::AddUtility(t,(string *)(*(long *)(p_Var9 + 1) + 0xc0),this_00);
    }
    if ((this->TargetsFolder)._M_string_length != 0) {
      tools._M_dataplus._M_p = (pointer)&tools.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"FOLDER","");
      cmTarget::SetProperty(t,&tools,(this->TargetsFolder)._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tools._M_dataplus._M_p != &tools.field_2) {
        operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
      }
    }
    cmTarget::AddUtility(this->Target->Target,&utilityName->Name,this_00);
    if ((this->AutogenTarget).GlobalTarget == true) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,lg,&utilityName->Name);
    }
  }
  else {
    for (p_Var9 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var9 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      cmTarget::AddUtility(this->Target->Target,(string *)(*(long *)(p_Var9 + 1) + 0xc0),this_00);
    }
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    no_deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             &currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,&autogenProvides);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_78,&no_deps);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_90,
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    cmCustomCommand::cmCustomCommand
              ((cmCustomCommand *)&tools,this_00,&local_48,&local_60,&local_78,
               (cmCustomCommandLines *)&local_90,autogenComment._M_dataplus._M_p,
               (this->Dir).Work._M_dataplus._M_p);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)&tools,false);
    cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)&tools,true);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::push_back
              (&this->Target->Target->PreBuildCommands,(value_type *)&tools);
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)&tools);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&no_deps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)autogenComment._M_dataplus._M_p != &autogenComment.field_2) {
    operator_delete(autogenComment._M_dataplus._M_p,
                    CONCAT71(autogenComment.field_2._M_allocated_capacity._1_7_,
                             autogenComment.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&autogenProvides);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
  cmGlobalGenerator* globalGen = localGen->GetGlobalGenerator();

  // Register info file as generated by CMake
  makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Files provided by the autogen target
  std::vector<std::string> autogenProvides;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.MocsCompilation, this->Moc, true);
    autogenProvides.push_back(this->Moc.MocsCompilation);
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = "Automatic ";
    autogenComment += tools;
    autogenComment += " for target ";
    autogenComment += this->Target->GetName();
  }

  // Compose command lines
  cmCustomCommandLines commandLines;
  {
    cmCustomCommandLine currentLine;
    currentLine.push_back(cmSystemTools::GetCMakeCommand());
    currentLine.push_back("-E");
    currentLine.push_back("cmake_autogen");
    currentLine.push_back(this->AutogenTarget.InfoFile);
    currentLine.push_back("$<CONFIGURATION>");
    commandLines.push_back(std::move(currentLine));
  }

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (globalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      this->Target->Target->AddUtility(depTarget->GetName(), makefile);
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    const std::vector<std::string> no_output;
    const std::vector<std::string> no_deps;
    cmCustomCommand cc(makefile, no_output, autogenProvides, no_deps,
                       commandLines, autogenComment.c_str(),
                       this->Dir.Work.c_str());
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->Target->Target->AddPreBuildCommand(cc);
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->Target->GetLinkImplementationLibraries(config);
        if (libs != nullptr) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if ((libTarget != nullptr) &&
                !StaticLibraryCycle(this->Target, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    // Create autogen target
    cmTarget* autogenTarget = makefile->AddUtilityCommand(
      this->AutogenTarget.Name, cmMakefile::TargetOrigin::Generator, true,
      this->Dir.Work.c_str(), /*byproducts=*/autogenProvides,
      std::vector<std::string>(this->AutogenTarget.DependFiles.begin(),
                               this->AutogenTarget.DependFiles.end()),
      commandLines, false, autogenComment.c_str());
    // Create autogen generator target
    localGen->AddGeneratorTarget(
      new cmGeneratorTarget(autogenTarget, localGen));

    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::string> const& depName : this->Target->GetUtilities()) {
        autogenTarget->AddUtility(depName.Value, makefile);
      }
    }
    // Add additional autogen target dependencies to autogen target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      autogenTarget->AddUtility(depTarget->GetName(), makefile);
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder.c_str());
    }

    // Add autogen target to the origin target dependencies
    this->Target->Target->AddUtility(this->AutogenTarget.Name, makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(localGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}